

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O1

R2Point __thiscall S2::MercatorProjection::Project(MercatorProjection *this,S2Point *p)

{
  double dVar1;
  R2Point RVar2;
  S2LatLng local_20;
  
  S2LatLng::S2LatLng(&local_20,p);
  dVar1 = sin(local_20.coords_.c_[0]);
  dVar1 = log((dVar1 + 1.0) / (1.0 - dVar1));
  RVar2.c_[1] = this->from_radians_ * dVar1 * 0.5;
  RVar2.c_[0] = local_20.coords_.c_[1] * this->from_radians_;
  return (R2Point)RVar2.c_;
}

Assistant:

R2Point MercatorProjection::Project(const S2Point& p) const {
  return FromLatLng(S2LatLng(p));
}